

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

section * __thiscall ELFIO::elfio::Sections::add(Sections *this,string *name)

{
  Elf_Half EVar1;
  section *psVar2;
  reference this_00;
  Elf_Word local_3c;
  Elf_Word pos;
  string_section_accessor str_writer;
  section *string_table;
  Elf_Half str_index;
  section *new_section;
  string *name_local;
  Sections *this_local;
  
  psVar2 = create_section(this->parent);
  (*psVar2->_vptr_section[4])(psVar2,name);
  EVar1 = get_section_name_str_index(this->parent);
  this_00 = std::
            vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
            ::operator[](&this->parent->sections_,(ulong)EVar1);
  str_writer.string_section =
       std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>::get(this_00);
  string_section_accessor_template<ELFIO::section>::string_section_accessor_template
            ((string_section_accessor_template<ELFIO::section> *)&stack0xffffffffffffffc8,
             str_writer.string_section);
  local_3c = string_section_accessor_template<ELFIO::section>::add_string
                       ((string_section_accessor_template<ELFIO::section> *)&stack0xffffffffffffffc8
                        ,name);
  (*psVar2->_vptr_section[0x16])(psVar2,&local_3c);
  return psVar2;
}

Assistant:

section* add( const std::string& name ) const
        {
            section* new_section = parent->create_section();
            new_section->set_name( name );

            Elf_Half str_index = parent->get_section_name_str_index();
            section* string_table( parent->sections_[str_index].get() );
            string_section_accessor str_writer( string_table );
            Elf_Word                pos = str_writer.add_string( name );
            new_section->set_name_string_offset( pos );

            return new_section;
        }